

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

AST * jsonnet::internal::left_recursive_deep(AST *ast_)

{
  AST *in_RDI;
  AST *left;
  AST *last;
  AST *in_stack_00000058;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = left_recursive(in_stack_00000058);
  local_10 = in_RDI;
  while (local_18 != (AST *)0x0) {
    local_10 = local_18;
    local_18 = left_recursive(in_stack_00000058);
  }
  return local_10;
}

Assistant:

static AST *left_recursive_deep(AST *ast_)
{
    AST *last = ast_;
    AST *left = left_recursive(ast_);

    while (left != nullptr) {
        last = left;
        left = left_recursive(last);
    }
    return last;
}